

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  Mat *in_RDI;
  int i;
  Mat *in_stack_ffffffffffffff98;
  Mat local_58;
  int local_c;
  
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    in_RDI->refcount[(long)local_c * 0x14] = 0;
    ncnn::Mat::Mat(&local_58);
    ncnn::Mat::operator=(in_stack_ffffffffffffff98,in_RDI);
    ncnn::Mat::~Mat((Mat *)0x162221);
  }
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].v = Mat();
    }
}